

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface.cc
# Opt level: O2

string * __thiscall
rcg::(anonymous_namespace)::cIFGetInfo_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,Interface *obj,
          shared_ptr<const_rcg::GenTLWrapper> *gentl,INTERFACE_INFO_CMD info)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  int iVar2;
  void *pvVar3;
  size_t i;
  ulong uVar4;
  INFO_DATATYPE type;
  size_t tmp_size;
  char tmp [1024];
  int local_454;
  ulong local_450;
  __shared_ptr<rcg::System,_(__gnu_cxx::_Lock_policy)2> local_448;
  char local_438 [1032];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_454 = 0;
  memset(local_438,0,0x400);
  local_450 = 0x400;
  if (*(long *)(this + 0x80) == 0) {
    std::__shared_ptr<rcg::System,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_448,(__shared_ptr<rcg::System,_(__gnu_cxx::_Lock_policy)2> *)(this + 0x10));
    pvVar3 = System::getHandle(local_448._M_ptr);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_448._M_refcount);
    if (pvVar3 == (void *)0x0) {
      iVar2 = -0x3e9;
    }
    else {
      p_Var1 = (((obj->super_enable_shared_from_this<rcg::Interface>)._M_weak_this.
                 super___weak_ptr<rcg::Interface,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->nodemap).
               super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
      std::__shared_ptr<rcg::System,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_448,(__shared_ptr<rcg::System,_(__gnu_cxx::_Lock_policy)2> *)(this + 0x10));
      pvVar3 = System::getHandle(local_448._M_ptr);
      iVar2 = (*(code *)p_Var1)(pvVar3,*(undefined8 *)(this + 0x30),(ulong)gentl & 0xffffffff,
                                &local_454,local_438,&local_450);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_448._M_refcount);
    }
  }
  else {
    iVar2 = (**(code **)&(obj->super_enable_shared_from_this<rcg::Interface>)._M_weak_this.
                         super___weak_ptr<rcg::Interface,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
                         super_enable_shared_from_this<rcg::Interface>._M_weak_this.
                         super___weak_ptr<rcg::Interface,_(__gnu_cxx::_Lock_policy)2>)
                      (*(long *)(this + 0x80),(ulong)gentl & 0xffffffff,&local_454,local_438,
                       &local_450);
  }
  if ((iVar2 == 0) && (local_454 == 1)) {
    for (uVar4 = 0; (uVar4 < local_450 && (local_438[uVar4] != '\0')); uVar4 = uVar4 + 1) {
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cIFGetInfo(const Interface *obj,
                       const std::shared_ptr<const GenTLWrapper> &gentl,
                       GenTL::INTERFACE_INFO_CMD info)
{
  std::string ret;

  GenTL::INFO_DATATYPE type=GenTL::INFO_DATATYPE_UNKNOWN;
  char tmp[1024]="";
  size_t tmp_size=sizeof(tmp);
  GenTL::GC_ERROR err=GenTL::GC_ERR_ERROR;

  if (obj->getHandle() != 0)
  {
    err=gentl->IFGetInfo(obj->getHandle(), info, &type, tmp, &tmp_size);
  }
  else if (obj->getParent()->getHandle() != 0)
  {
    err=gentl->TLGetInterfaceInfo(obj->getParent()->getHandle(), obj->getID().c_str(), info,
                                  &type, tmp, &tmp_size);
  }

  if (err == GenTL::GC_ERR_SUCCESS && type == GenTL::INFO_DATATYPE_STRING)
  {
    for (size_t i=0; i<tmp_size && tmp[i] != '\0'; i++)
    {
      ret.push_back(tmp[i]);
    }
  }

  return ret;
}